

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

void alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
     build_node_implicit_sampling
               (V *values,int num_keys,int sample_num_keys,int sample_data_capacity,int step_size,
               StatAccumulator *ent,LinearModel<int> *sample_model)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 in_XMM2_Qb;
  
  uVar1 = sample_data_capacity - 1;
  uVar6 = 0xffffffffffffffff;
  lVar7 = 0;
  while( true ) {
    if (num_keys <= lVar7) {
      return;
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = sample_model->a_;
    auVar10._0_8_ = (double)values[lVar7].first;
    auVar10._8_8_ = in_XMM2_Qb;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = sample_model->b_;
    auVar2 = vfmadd213sd_fma(auVar10,auVar8,auVar2);
    uVar4 = uVar1;
    if ((int)auVar2._0_8_ <= (int)uVar1) {
      uVar4 = (int)auVar2._0_8_;
    }
    uVar5 = (int)uVar6 + 1;
    uVar4 = ~((int)uVar4 >> 0x1f) & uVar4;
    if ((int)uVar5 < (int)uVar4) {
      uVar5 = uVar4;
    }
    uVar6 = (ulong)uVar5;
    if ((int)(sample_data_capacity - uVar5) < sample_num_keys) break;
    (*ent->_vptr_StatAccumulator[2])(ent,uVar6);
    lVar7 = lVar7 + step_size;
    sample_num_keys = sample_num_keys + -1;
  }
  uVar4 = sample_data_capacity - sample_num_keys;
  for (; lVar7 < num_keys; lVar7 = lVar7 + step_size) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = sample_model->a_;
    auVar11._0_8_ = (double)values[lVar7].first;
    auVar11._8_8_ = in_XMM2_Qb;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = sample_model->b_;
    auVar2 = vfmadd213sd_fma(auVar11,auVar9,auVar3);
    uVar5 = uVar1;
    if ((int)auVar2._0_8_ <= (int)uVar1) {
      uVar5 = (int)auVar2._0_8_;
    }
    (*ent->_vptr_StatAccumulator[2])(ent,(ulong)uVar4,(ulong)(~((int)uVar5 >> 0x1f) & uVar5));
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

static void build_node_implicit_sampling(const V* values, int num_keys,
                                           int sample_num_keys,
                                           int sample_data_capacity,
                                           int step_size, StatAccumulator* ent,
                                           const LinearModel<T>* sample_model) {
    int last_position = -1;
    int sample_keys_remaining = sample_num_keys;
    for (int i = 0; i < num_keys; i += step_size) {
      int predicted_position =
          std::max(0, std::min(sample_data_capacity - 1,
                               sample_model->predict(values[i].first)));
      int actual_position =
          std::max<int>(predicted_position, last_position + 1);
      int positions_remaining = sample_data_capacity - actual_position;
      if (positions_remaining < sample_keys_remaining) {
        actual_position = sample_data_capacity - sample_keys_remaining;
        for (int j = i; j < num_keys; j += step_size) {
          predicted_position =
              std::max(0, std::min(sample_data_capacity - 1,
                                   sample_model->predict(values[j].first)));
          ent->accumulate(actual_position, predicted_position);
          actual_position++;
        }
        break;
      }
      ent->accumulate(actual_position, predicted_position);
      last_position = actual_position;
      sample_keys_remaining--;
    }
  }